

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_list.cpp
# Opt level: O0

Am_Priority_List_Item * __thiscall
Am_Priority_List::take_out_obj(Am_Priority_List *this,Am_Object *obj)

{
  bool bVar1;
  Am_Priority_List_Item *pAVar2;
  Am_Priority_List_Item *local_28;
  Am_Priority_List_Item *p;
  Am_Object *obj_local;
  Am_Priority_List *this_local;
  
  local_28 = this->head;
  while( true ) {
    if (local_28 == (Am_Priority_List_Item *)0x0) {
      return (Am_Priority_List_Item *)0x0;
    }
    bVar1 = Am_Object::operator==(&local_28->obj,obj);
    if (bVar1) break;
    local_28 = local_28->next;
  }
  pAVar2 = take_out_item(this,local_28);
  return pAVar2;
}

Assistant:

Am_Priority_List_Item *
Am_Priority_List::take_out_obj(Am_Object obj)
{
  Am_Priority_List_Item *p = head;
  for (; p != nullptr; p = p->next) {
    if (p->obj == obj)
      return this->take_out_item(p);
  }
  return nullptr;
}